

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::to_string_abi_cxx11_(uncertain_measurement *measure,uint64_t match_flags)

{
  ostream *match_flags_00;
  uncertain_measurement *in_RSI;
  string *in_RDI;
  float fVar1;
  double dVar2;
  stringstream ss;
  streamsize digits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uncertain_measurement *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *units;
  long local_1f8;
  string local_1d8 [48];
  long local_1a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [11];
  long local_20;
  uncertain_measurement *local_10;
  
  local_10 = in_RSI;
  dVar2 = uncertain_measurement::fractional_uncertainty(in_stack_fffffffffffffde0);
  dVar2 = log10(dVar2);
  dVar2 = ceil(-dVar2);
  if ((long)dVar2 < 2) {
    local_1f8 = 2;
  }
  else {
    local_1f8 = (long)dVar2 + 1;
  }
  local_20 = local_1f8;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  CLI::std::ios_base::precision
            ((ios_base *)((long)local_1a8 + *(long *)(local_1a8[0] + -0x18)),local_20);
  fVar1 = uncertain_measurement::value_f(local_10);
  std::ostream::operator<<(local_198,fVar1);
  std::operator<<((ostream *)local_198,"+/-");
  CLI::std::ios_base::precision((ios_base *)((long)local_1a8 + *(long *)(local_1a8[0] + -0x18)),2);
  units = local_198;
  fVar1 = uncertain_measurement::uncertainty_f(local_10);
  match_flags_00 = (ostream *)std::ostream::operator<<(units,fVar1);
  std::operator<<(match_flags_00,' ');
  CLI::std::ios_base::precision
            ((ios_base *)((long)local_1a8 + *(long *)(local_1a8[0] + -0x18)),local_20);
  this = local_198;
  uncertain_measurement::units(local_10);
  to_string_abi_cxx11_((unit *)units,(uint64_t)match_flags_00);
  std::operator<<((ostream *)this,local_1d8);
  std::__cxx11::string::~string(this);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return in_RDI;
}

Assistant:

std::string
    to_string(const uncertain_measurement& measure, std::uint64_t match_flags)
{
    // compute the correct number of digits to display for uncertain precision
    auto digits = static_cast<std::streamsize>(
        ceil(-log10(measure.fractional_uncertainty())));
    digits = (digits < 2) ? 2 : digits + 1;
    std::stringstream ss;
    ss.precision(digits);
    ss << measure.value_f();
    ss << "+/-";
    ss.precision(2);
    ss << measure.uncertainty_f() << ' ';
    ss.precision(digits);
    ss << to_string(measure.units(), match_flags);
    return ss.str();
}